

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::CurrenciesTest_test_inverse_pairs_are_not_valid_Test::TestBody
          (CurrenciesTest_test_inverse_pairs_are_not_valid_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_1838;
  AssertHelper local_1818;
  Message local_1810;
  allocator<char> local_1801;
  string local_1800 [39];
  bool local_17d9;
  undefined1 local_17d8 [8];
  AssertionResult gtest_ar__54;
  AssertHelper local_17a8;
  Message local_17a0;
  allocator<char> local_1791;
  string local_1790 [39];
  bool local_1769;
  undefined1 local_1768 [8];
  AssertionResult gtest_ar__53;
  AssertHelper local_1738;
  Message local_1730;
  allocator<char> local_1721;
  string local_1720 [39];
  bool local_16f9;
  undefined1 local_16f8 [8];
  AssertionResult gtest_ar__52;
  AssertHelper local_16c8;
  Message local_16c0;
  allocator<char> local_16b1;
  string local_16b0 [39];
  bool local_1689;
  undefined1 local_1688 [8];
  AssertionResult gtest_ar__51;
  AssertHelper local_1658;
  Message local_1650;
  allocator<char> local_1641;
  string local_1640 [39];
  bool local_1619;
  undefined1 local_1618 [8];
  AssertionResult gtest_ar__50;
  AssertHelper local_15e8;
  Message local_15e0;
  allocator<char> local_15d1;
  string local_15d0 [39];
  bool local_15a9;
  undefined1 local_15a8 [8];
  AssertionResult gtest_ar__49;
  AssertHelper local_1578;
  Message local_1570;
  allocator<char> local_1561;
  string local_1560 [39];
  bool local_1539;
  undefined1 local_1538 [8];
  AssertionResult gtest_ar__48;
  AssertHelper local_1508;
  Message local_1500;
  allocator<char> local_14f1;
  string local_14f0 [39];
  bool local_14c9;
  undefined1 local_14c8 [8];
  AssertionResult gtest_ar__47;
  AssertHelper local_1498;
  Message local_1490;
  allocator<char> local_1481;
  string local_1480 [39];
  bool local_1459;
  undefined1 local_1458 [8];
  AssertionResult gtest_ar__46;
  AssertHelper local_1428;
  Message local_1420;
  allocator<char> local_1411;
  string local_1410 [39];
  bool local_13e9;
  undefined1 local_13e8 [8];
  AssertionResult gtest_ar__45;
  AssertHelper local_13b8;
  Message local_13b0;
  allocator<char> local_13a1;
  string local_13a0 [39];
  bool local_1379;
  undefined1 local_1378 [8];
  AssertionResult gtest_ar__44;
  AssertHelper local_1348;
  Message local_1340;
  allocator<char> local_1331;
  string local_1330 [39];
  bool local_1309;
  undefined1 local_1308 [8];
  AssertionResult gtest_ar__43;
  AssertHelper local_12d8;
  Message local_12d0;
  allocator<char> local_12c1;
  string local_12c0 [39];
  bool local_1299;
  undefined1 local_1298 [8];
  AssertionResult gtest_ar__42;
  AssertHelper local_1268;
  Message local_1260;
  allocator<char> local_1251;
  string local_1250 [39];
  bool local_1229;
  undefined1 local_1228 [8];
  AssertionResult gtest_ar__41;
  AssertHelper local_11f8;
  Message local_11f0;
  allocator<char> local_11e1;
  string local_11e0 [39];
  bool local_11b9;
  undefined1 local_11b8 [8];
  AssertionResult gtest_ar__40;
  AssertHelper local_1188;
  Message local_1180;
  allocator<char> local_1171;
  string local_1170 [39];
  bool local_1149;
  undefined1 local_1148 [8];
  AssertionResult gtest_ar__39;
  AssertHelper local_1118;
  Message local_1110;
  allocator<char> local_1101;
  string local_1100 [39];
  bool local_10d9;
  undefined1 local_10d8 [8];
  AssertionResult gtest_ar__38;
  AssertHelper local_10a8;
  Message local_10a0;
  allocator<char> local_1091;
  string local_1090 [39];
  bool local_1069;
  undefined1 local_1068 [8];
  AssertionResult gtest_ar__37;
  AssertHelper local_1038;
  Message local_1030;
  allocator<char> local_1021;
  string local_1020 [39];
  bool local_ff9;
  undefined1 local_ff8 [8];
  AssertionResult gtest_ar__36;
  AssertHelper local_fc8;
  Message local_fc0;
  allocator<char> local_fb1;
  string local_fb0 [39];
  bool local_f89;
  undefined1 local_f88 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_f58;
  Message local_f50;
  allocator<char> local_f41;
  string local_f40 [39];
  bool local_f19;
  undefined1 local_f18 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_ee8;
  Message local_ee0;
  allocator<char> local_ed1;
  string local_ed0 [39];
  bool local_ea9;
  undefined1 local_ea8 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_e78;
  Message local_e70;
  allocator<char> local_e61;
  string local_e60 [39];
  bool local_e39;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_e08;
  Message local_e00;
  allocator<char> local_df1;
  string local_df0 [39];
  bool local_dc9;
  undefined1 local_dc8 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_d98;
  Message local_d90;
  allocator<char> local_d81;
  string local_d80 [39];
  bool local_d59;
  undefined1 local_d58 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_d28;
  Message local_d20;
  allocator<char> local_d11;
  string local_d10 [39];
  bool local_ce9;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_cb8;
  Message local_cb0;
  allocator<char> local_ca1;
  string local_ca0 [39];
  bool local_c79;
  undefined1 local_c78 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_c48;
  Message local_c40;
  allocator<char> local_c31;
  string local_c30 [39];
  bool local_c09;
  undefined1 local_c08 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_bd8;
  Message local_bd0;
  allocator<char> local_bc1;
  string local_bc0 [39];
  bool local_b99;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_b68;
  Message local_b60;
  allocator<char> local_b51;
  string local_b50 [39];
  bool local_b29;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_af8;
  Message local_af0;
  allocator<char> local_ae1;
  string local_ae0 [39];
  bool local_ab9;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_a88;
  Message local_a80;
  allocator<char> local_a71;
  string local_a70 [39];
  bool local_a49;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_a18;
  Message local_a10;
  allocator<char> local_a01;
  string local_a00 [39];
  bool local_9d9;
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_9a8;
  Message local_9a0;
  allocator<char> local_991;
  string local_990 [39];
  bool local_969;
  undefined1 local_968 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_938;
  Message local_930;
  allocator<char> local_921;
  string local_920 [39];
  bool local_8f9;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_8c8;
  Message local_8c0;
  allocator<char> local_8b1;
  string local_8b0 [39];
  bool local_889;
  undefined1 local_888 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_858;
  Message local_850;
  allocator<char> local_841;
  string local_840 [39];
  bool local_819;
  undefined1 local_818 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_7e8;
  Message local_7e0;
  allocator<char> local_7d1;
  string local_7d0 [39];
  bool local_7a9;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_778;
  Message local_770;
  allocator<char> local_761;
  string local_760 [39];
  bool local_739;
  undefined1 local_738 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_708;
  Message local_700;
  allocator<char> local_6f1;
  string local_6f0 [39];
  bool local_6c9;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_698;
  Message local_690;
  allocator<char> local_681;
  string local_680 [39];
  bool local_659;
  undefined1 local_658 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_628;
  Message local_620;
  allocator<char> local_611;
  string local_610 [39];
  bool local_5e9;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_5b8;
  Message local_5b0;
  allocator<char> local_5a1;
  string local_5a0 [39];
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_548;
  Message local_540;
  allocator<char> local_531;
  string local_530 [39];
  bool local_509;
  undefined1 local_508 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_4d8;
  Message local_4d0;
  allocator<char> local_4c1;
  string local_4c0 [39];
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_468;
  Message local_460;
  allocator<char> local_451;
  string local_450 [39];
  bool local_429;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_3f8;
  Message local_3f0;
  allocator<char> local_3e1;
  string local_3e0 [39];
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_388;
  Message local_380;
  allocator<char> local_371;
  string local_370 [39];
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_318;
  Message local_310;
  allocator<char> local_301;
  string local_300 [39];
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2a8;
  Message local_2a0;
  allocator<char> local_291;
  string local_290 [39];
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_238;
  Message local_230;
  allocator<char> local_221;
  string local_220 [39];
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1c8;
  Message local_1c0;
  allocator<char> local_1b1;
  string local_1b0 [39];
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_158;
  Message local_150;
  allocator<char> local_141;
  string local_140 [39];
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_e8;
  Message local_e0;
  allocator<char> local_d1;
  string local_d0 [39];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70;
  Message local_68 [3];
  allocator<char> local_49;
  string local_48 [39];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  CurrenciesTest_test_inverse_pairs_are_not_valid_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"GBPEUR",&local_49);
  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_48);
  local_21 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_20,
               (AssertionResult *)"Currencies::IsValidCurrencyPair(\"GBPEUR\")","true","false",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(local_68);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d0,"AUDEUR",&local_d1);
    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_d0);
    local_a9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a8,&local_a9,(type *)0x0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a8,
                 (AssertionResult *)"Currencies::IsValidCurrencyPair(\"AUDEUR\")","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x91,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_e0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_140,"NZDEUR",&local_141);
      bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_140);
      local_119 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_118,&local_119,(type *)0x0);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar2) {
        testing::Message::Message(&local_150);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_118,
                   (AssertionResult *)"Currencies::IsValidCurrencyPair(\"NZDEUR\")","true","false",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                   ,0x92,pcVar3);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_150);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1b0,"USDEUR",&local_1b1);
        bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_1b0);
        local_189 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_188,&local_189,(type *)0x0);
        std::__cxx11::string::~string(local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
        if (!bVar2) {
          testing::Message::Message(&local_1c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_188,
                     (AssertionResult *)"Currencies::IsValidCurrencyPair(\"USDEUR\")","true","false"
                     ,in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                     ,0x93,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
          testing::internal::AssertHelper::~AssertHelper(&local_1c8);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_1c0);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_220,"CADEUR",&local_221);
          bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_220);
          local_1f9 = (bool)(~bVar1 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
          std::__cxx11::string::~string(local_220);
          std::allocator<char>::~allocator(&local_221);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
          if (!bVar2) {
            testing::Message::Message(&local_230);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_1f8,
                       (AssertionResult *)"Currencies::IsValidCurrencyPair(\"CADEUR\")","true",
                       "false",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_238,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                       ,0x94,pcVar3);
            testing::internal::AssertHelper::operator=(&local_238,&local_230);
            testing::internal::AssertHelper::~AssertHelper(&local_238);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_230);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_290,"CHFEUR",&local_291);
            bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_290);
            local_269 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_268,&local_269,(type *)0x0);
            std::__cxx11::string::~string(local_290);
            std::allocator<char>::~allocator(&local_291);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
            if (!bVar2) {
              testing::Message::Message(&local_2a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_268,
                         (AssertionResult *)"Currencies::IsValidCurrencyPair(\"CHFEUR\")","true",
                         "false",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                         ,0x95,pcVar3);
              testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
              testing::internal::AssertHelper::~AssertHelper(&local_2a8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_2a0);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(local_300,"NOKEUR",&local_301);
              bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_300);
              local_2d9 = (bool)(~bVar1 & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
              std::__cxx11::string::~string(local_300);
              std::allocator<char>::~allocator(&local_301);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
              if (!bVar2) {
                testing::Message::Message(&local_310);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_2d8,
                           (AssertionResult *)"Currencies::IsValidCurrencyPair(\"NOKEUR\")","true",
                           "false",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_318,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                           ,0x96,pcVar3);
                testing::internal::AssertHelper::operator=(&local_318,&local_310);
                testing::internal::AssertHelper::~AssertHelper(&local_318);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_310);
              }
              gtest_ar__1.message_.ptr_._5_3_ = 0;
              gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>(local_370,"DKKEUR",&local_371);
                bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_370);
                local_349 = (bool)(~bVar1 & 1);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_348,&local_349,(type *)0x0);
                std::__cxx11::string::~string(local_370);
                std::allocator<char>::~allocator(&local_371);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_348);
                if (!bVar2) {
                  testing::Message::Message(&local_380);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_348,
                             (AssertionResult *)"Currencies::IsValidCurrencyPair(\"DKKEUR\")","true"
                             ,"false",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_388,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                             ,0x97,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_388,&local_380);
                  testing::internal::AssertHelper::~AssertHelper(&local_388);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_380);
                }
                gtest_ar__1.message_.ptr_._5_3_ = 0;
                gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"SEKEUR",&local_3e1);
                  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_3e0);
                  local_3b9 = (bool)(~bVar1 & 1);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_3b8,&local_3b9,(type *)0x0);
                  std::__cxx11::string::~string(local_3e0);
                  std::allocator<char>::~allocator(&local_3e1);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3b8);
                  if (!bVar2) {
                    testing::Message::Message(&local_3f0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_3b8,
                               (AssertionResult *)"Currencies::IsValidCurrencyPair(\"SEKEUR\")",
                               "true","false",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                               ,0x98,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
                    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_3f0);
                  }
                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_450,"JPYEUR",&local_451);
                    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_450);
                    local_429 = (bool)(~bVar1 & 1);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_428,&local_429,(type *)0x0);
                    std::__cxx11::string::~string(local_450);
                    std::allocator<char>::~allocator(&local_451);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_428);
                    if (!bVar2) {
                      testing::Message::Message(&local_460);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_428,
                                 (AssertionResult *)"Currencies::IsValidCurrencyPair(\"JPYEUR\")",
                                 "true","false",in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_468,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                 ,0x99,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_468,&local_460);
                      testing::internal::AssertHelper::~AssertHelper(&local_468);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_460);
                    }
                    gtest_ar__1.message_.ptr_._5_3_ = 0;
                    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
                    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_4c0,"AUDGBP",&local_4c1);
                      bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_4c0);
                      local_499 = (bool)(~bVar1 & 1);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_498,&local_499,(type *)0x0);
                      std::__cxx11::string::~string(local_4c0);
                      std::allocator<char>::~allocator(&local_4c1);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_498);
                      if (!bVar2) {
                        testing::Message::Message(&local_4d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__11.message_,(internal *)local_498,
                                   (AssertionResult *)"Currencies::IsValidCurrencyPair(\"AUDGBP\")",
                                   "true","false",in_R9);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_4d8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                   ,0x9a,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
                        testing::internal::AssertHelper::~AssertHelper(&local_4d8);
                        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
                        testing::Message::~Message(&local_4d0);
                      }
                      gtest_ar__1.message_.ptr_._5_3_ = 0;
                      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
                      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_530,"NZDGBP",&local_531);
                        bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair(local_530);
                        local_509 = (bool)(~bVar1 & 1);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_508,&local_509,(type *)0x0);
                        std::__cxx11::string::~string(local_530);
                        std::allocator<char>::~allocator(&local_531);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_508);
                        if (!bVar2) {
                          testing::Message::Message(&local_540);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__12.message_,(internal *)local_508,
                                     (AssertionResult *)
                                     "Currencies::IsValidCurrencyPair(\"NZDGBP\")","true","false",
                                     in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_548,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                     ,0x9b,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_548,&local_540);
                          testing::internal::AssertHelper::~AssertHelper(&local_548);
                          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                          testing::Message::~Message(&local_540);
                        }
                        gtest_ar__1.message_.ptr_._5_3_ = 0;
                        gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
                        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_5a0,"USDGBP",&local_5a1);
                          bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                            (local_5a0);
                          local_579 = (bool)(~bVar1 & 1);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_578,&local_579,(type *)0x0);
                          std::__cxx11::string::~string(local_5a0);
                          std::allocator<char>::~allocator(&local_5a1);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_578);
                          if (!bVar2) {
                            testing::Message::Message(&local_5b0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__13.message_,(internal *)local_578,
                                       (AssertionResult *)
                                       "Currencies::IsValidCurrencyPair(\"USDGBP\")","true","false",
                                       in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_5b8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                       ,0x9c,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
                            testing::internal::AssertHelper::~AssertHelper(&local_5b8);
                            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                            testing::Message::~Message(&local_5b0);
                          }
                          gtest_ar__1.message_.ptr_._5_3_ = 0;
                          gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
                          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_610,"CADGBP",&local_611);
                            bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                              (local_610);
                            local_5e9 = (bool)(~bVar1 & 1);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_5e8,&local_5e9,(type *)0x0);
                            std::__cxx11::string::~string(local_610);
                            std::allocator<char>::~allocator(&local_611);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_5e8);
                            if (!bVar2) {
                              testing::Message::Message(&local_620);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__14.message_,(internal *)local_5e8,
                                         (AssertionResult *)
                                         "Currencies::IsValidCurrencyPair(\"CADGBP\")","true",
                                         "false",in_R9);
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_628,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                         ,0x9d,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_628,&local_620);
                              testing::internal::AssertHelper::~AssertHelper(&local_628);
                              std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                              testing::Message::~Message(&local_620);
                            }
                            gtest_ar__1.message_.ptr_._5_3_ = 0;
                            gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8)
                            ;
                            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_680,"CHFGBP",&local_681);
                              bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                (local_680);
                              local_659 = (bool)(~bVar1 & 1);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_658,&local_659,(type *)0x0);
                              std::__cxx11::string::~string(local_680);
                              std::allocator<char>::~allocator(&local_681);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_658);
                              if (!bVar2) {
                                testing::Message::Message(&local_690);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__15.message_,(internal *)local_658,
                                           (AssertionResult *)
                                           "Currencies::IsValidCurrencyPair(\"CHFGBP\")","true",
                                           "false",in_R9);
                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_698,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                           ,0x9e,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_698,&local_690);
                                testing::internal::AssertHelper::~AssertHelper(&local_698);
                                std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                                testing::Message::~Message(&local_690);
                              }
                              gtest_ar__1.message_.ptr_._5_3_ = 0;
                              gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_658);
                              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_6f0,"NOKGBP",&local_6f1);
                                bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                  (local_6f0);
                                local_6c9 = (bool)(~bVar1 & 1);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_6c8,&local_6c9,(type *)0x0);
                                std::__cxx11::string::~string(local_6f0);
                                std::allocator<char>::~allocator(&local_6f1);
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_6c8);
                                if (!bVar2) {
                                  testing::Message::Message(&local_700);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__16.message_,(internal *)local_6c8,
                                             (AssertionResult *)
                                             "Currencies::IsValidCurrencyPair(\"NOKGBP\")","true",
                                             "false",in_R9);
                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_708,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                             ,0x9f,pcVar3);
                                  testing::internal::AssertHelper::operator=(&local_708,&local_700);
                                  testing::internal::AssertHelper::~AssertHelper(&local_708);
                                  std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                                  testing::Message::~Message(&local_700);
                                }
                                gtest_ar__1.message_.ptr_._5_3_ = 0;
                                gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_6c8);
                                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_760,"DKKGBP",&local_761);
                                  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                    (local_760);
                                  local_739 = (bool)(~bVar1 & 1);
                                  testing::AssertionResult::AssertionResult<bool>
                                            ((AssertionResult *)local_738,&local_739,(type *)0x0);
                                  std::__cxx11::string::~string(local_760);
                                  std::allocator<char>::~allocator(&local_761);
                                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_738);
                                  if (!bVar2) {
                                    testing::Message::Message(&local_770);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar__17.message_,
                                               (internal *)local_738,
                                               (AssertionResult *)
                                               "Currencies::IsValidCurrencyPair(\"DKKGBP\")","true",
                                               "false",in_R9);
                                    pcVar3 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_778,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                               ,0xa0,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              (&local_778,&local_770);
                                    testing::internal::AssertHelper::~AssertHelper(&local_778);
                                    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                                    testing::Message::~Message(&local_770);
                                  }
                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_738);
                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_7d0,"SEKGBP",&local_7d1);
                                    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrencyPair
                                                      (local_7d0);
                                    local_7a9 = (bool)(~bVar1 & 1);
                                    testing::AssertionResult::AssertionResult<bool>
                                              ((AssertionResult *)local_7a8,&local_7a9,(type *)0x0);
                                    std::__cxx11::string::~string(local_7d0);
                                    std::allocator<char>::~allocator(&local_7d1);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_7a8);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_7e0);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar__18.message_,
                                                 (internal *)local_7a8,
                                                 (AssertionResult *)
                                                 "Currencies::IsValidCurrencyPair(\"SEKGBP\")",
                                                 "true","false",in_R9);
                                      pcVar3 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_7e8,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                 ,0xa1,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                (&local_7e8,&local_7e0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_7e8);
                                      std::__cxx11::string::~string
                                                ((string *)&gtest_ar__18.message_);
                                      testing::Message::~Message(&local_7e0);
                                    }
                                    gtest_ar__1.message_.ptr_._5_3_ = 0;
                                    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_7a8);
                                    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_840,"JPYGBP",&local_841);
                                      bVar1 = bidfx_public_api::price::Currencies::
                                              IsValidCurrencyPair(local_840);
                                      local_819 = (bool)(~bVar1 & 1);
                                      testing::AssertionResult::AssertionResult<bool>
                                                ((AssertionResult *)local_818,&local_819,(type *)0x0
                                                );
                                      std::__cxx11::string::~string(local_840);
                                      std::allocator<char>::~allocator(&local_841);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_818);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_850);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)&gtest_ar__19.message_,
                                                   (internal *)local_818,
                                                   (AssertionResult *)
                                                   "Currencies::IsValidCurrencyPair(\"JPYGBP\")",
                                                   "true","false",in_R9);
                                        pcVar3 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_858,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa2,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_858,&local_850);
                                        testing::internal::AssertHelper::~AssertHelper(&local_858);
                                        std::__cxx11::string::~string
                                                  ((string *)&gtest_ar__19.message_);
                                        testing::Message::~Message(&local_850);
                                      }
                                      gtest_ar__1.message_.ptr_._5_3_ = 0;
                                      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_818);
                                      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_8b0,"NZDAUD",&local_8b1);
                                        bVar1 = bidfx_public_api::price::Currencies::
                                                IsValidCurrencyPair(local_8b0);
                                        local_889 = (bool)(~bVar1 & 1);
                                        testing::AssertionResult::AssertionResult<bool>
                                                  ((AssertionResult *)local_888,&local_889,
                                                   (type *)0x0);
                                        std::__cxx11::string::~string(local_8b0);
                                        std::allocator<char>::~allocator(&local_8b1);
                                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_888);
                                        if (!bVar2) {
                                          testing::Message::Message(&local_8c0);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    ((string *)&gtest_ar__20.message_,
                                                     (internal *)local_888,
                                                     (AssertionResult *)
                                                     "Currencies::IsValidCurrencyPair(\"NZDAUD\")",
                                                     "true","false",in_R9);
                                          pcVar3 = (char *)std::__cxx11::string::c_str();
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_8c8,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa3,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_8c8,&local_8c0);
                                          testing::internal::AssertHelper::~AssertHelper(&local_8c8)
                                          ;
                                          std::__cxx11::string::~string
                                                    ((string *)&gtest_ar__20.message_);
                                          testing::Message::~Message(&local_8c0);
                                        }
                                        gtest_ar__1.message_.ptr_._5_3_ = 0;
                                        gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_888);
                                        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_920,"USDAUD",&local_921);
                                          bVar1 = bidfx_public_api::price::Currencies::
                                                  IsValidCurrencyPair(local_920);
                                          local_8f9 = (bool)(~bVar1 & 1);
                                          testing::AssertionResult::AssertionResult<bool>
                                                    ((AssertionResult *)local_8f8,&local_8f9,
                                                     (type *)0x0);
                                          std::__cxx11::string::~string(local_920);
                                          std::allocator<char>::~allocator(&local_921);
                                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_8f8);
                                          if (!bVar2) {
                                            testing::Message::Message(&local_930);
                                            testing::internal::
                                            GetBoolAssertionFailureMessage_abi_cxx11_
                                                      ((string *)&gtest_ar__21.message_,
                                                       (internal *)local_8f8,
                                                       (AssertionResult *)
                                                       "Currencies::IsValidCurrencyPair(\"USDAUD\")"
                                                       ,"true","false",in_R9);
                                            pcVar3 = (char *)std::__cxx11::string::c_str();
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_938,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa4,pcVar3);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_938,&local_930);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_938);
                                            std::__cxx11::string::~string
                                                      ((string *)&gtest_ar__21.message_);
                                            testing::Message::~Message(&local_930);
                                          }
                                          gtest_ar__1.message_.ptr_._5_3_ = 0;
                                          gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_8f8);
                                          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_990,"CADAUD",&local_991);
                                            bVar1 = bidfx_public_api::price::Currencies::
                                                    IsValidCurrencyPair(local_990);
                                            local_969 = (bool)(~bVar1 & 1);
                                            testing::AssertionResult::AssertionResult<bool>
                                                      ((AssertionResult *)local_968,&local_969,
                                                       (type *)0x0);
                                            std::__cxx11::string::~string(local_990);
                                            std::allocator<char>::~allocator(&local_991);
                                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_968);
                                            if (!bVar2) {
                                              testing::Message::Message(&local_9a0);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        ((string *)&gtest_ar__22.message_,
                                                         (internal *)local_968,
                                                         (AssertionResult *)
                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"CADAUD\")",
                                                  "true","false",in_R9);
                                              pcVar3 = (char *)std::__cxx11::string::c_str();
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_9a8,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa5,pcVar3);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_9a8,&local_9a0);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_9a8);
                                              std::__cxx11::string::~string
                                                        ((string *)&gtest_ar__22.message_);
                                              testing::Message::~Message(&local_9a0);
                                            }
                                            gtest_ar__1.message_.ptr_._5_3_ = 0;
                                            gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_968);
                                            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_a00,"CHFAUD",&local_a01);
                                              bVar1 = bidfx_public_api::price::Currencies::
                                                      IsValidCurrencyPair(local_a00);
                                              local_9d9 = (bool)(~bVar1 & 1);
                                              testing::AssertionResult::AssertionResult<bool>
                                                        ((AssertionResult *)local_9d8,&local_9d9,
                                                         (type *)0x0);
                                              std::__cxx11::string::~string(local_a00);
                                              std::allocator<char>::~allocator(&local_a01);
                                              bVar2 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_9d8);
                                              if (!bVar2) {
                                                testing::Message::Message(&local_a10);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)&gtest_ar__23.message_,
                                                           (internal *)local_9d8,
                                                           (AssertionResult *)
                                                                                                                      
                                                  "Currencies::IsValidCurrencyPair(\"CHFAUD\")",
                                                  "true","false",in_R9);
                                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_a18,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa6,pcVar3);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_a18,&local_a10);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_a18);
                                                std::__cxx11::string::~string
                                                          ((string *)&gtest_ar__23.message_);
                                                testing::Message::~Message(&local_a10);
                                              }
                                              gtest_ar__1.message_.ptr_._5_3_ = 0;
                                              gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_9d8);
                                              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          (local_a70,"NOKAUD",&local_a71);
                                                bVar1 = bidfx_public_api::price::Currencies::
                                                        IsValidCurrencyPair(local_a70);
                                                local_a49 = (bool)(~bVar1 & 1);
                                                testing::AssertionResult::AssertionResult<bool>
                                                          ((AssertionResult *)local_a48,&local_a49,
                                                           (type *)0x0);
                                                std::__cxx11::string::~string(local_a70);
                                                std::allocator<char>::~allocator(&local_a71);
                                                bVar2 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_a48);
                                                if (!bVar2) {
                                                  testing::Message::Message(&local_a80);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)&gtest_ar__24.message_,
                                                             (internal *)local_a48,
                                                             (AssertionResult *)
                                                                                                                          
                                                  "Currencies::IsValidCurrencyPair(\"NOKAUD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a88,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa7,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a88,&local_a80);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a88);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__24.message_);
                                                  testing::Message::~Message(&local_a80);
                                                }
                                                gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_a48);
                                                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_ae0,"DKKAUD",&local_ae1);
                                                  bVar1 = bidfx_public_api::price::Currencies::
                                                          IsValidCurrencyPair(local_ae0);
                                                  local_ab9 = (bool)(~bVar1 & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_ab8,&local_ab9
                                                             ,(type *)0x0);
                                                  std::__cxx11::string::~string(local_ae0);
                                                  std::allocator<char>::~allocator(&local_ae1);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_ab8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_af0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar__25.message_,
                                                               (internal *)local_ab8,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "Currencies::IsValidCurrencyPair(\"DKKAUD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_af8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa8,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_af8,&local_af0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_af8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__25.message_);
                                                  testing::Message::~Message(&local_af0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ab8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_b50,"SEKAUD",&local_b51);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_b50);
                                                    local_b29 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_b28,
                                                               &local_b29,(type *)0x0);
                                                    std::__cxx11::string::~string(local_b50);
                                                    std::allocator<char>::~allocator(&local_b51);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b28)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_b60);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__26.message_,
                                                                 (internal *)local_b28,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"SEKAUD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_b68,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xa9,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b68,&local_b60);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b68);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__26.message_);
                                                  testing::Message::~Message(&local_b60);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b28);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_bc0,"JPYAUD",&local_bc1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_bc0);
                                                    local_b99 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_b98,
                                                               &local_b99,(type *)0x0);
                                                    std::__cxx11::string::~string(local_bc0);
                                                    std::allocator<char>::~allocator(&local_bc1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b98)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_bd0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__27.message_,
                                                                 (internal *)local_b98,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYAUD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_bd8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xaa,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_bd8,&local_bd0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_bd8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__27.message_);
                                                  testing::Message::~Message(&local_bd0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b98);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_c30,"USDNZD",&local_c31);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_c30);
                                                    local_c09 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_c08,
                                                               &local_c09,(type *)0x0);
                                                    std::__cxx11::string::~string(local_c30);
                                                    std::allocator<char>::~allocator(&local_c31);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c08)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_c40);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__28.message_,
                                                                 (internal *)local_c08,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"USDNZD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_c48,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xab,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_c48,&local_c40);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_c48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__28.message_);
                                                  testing::Message::~Message(&local_c40);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c08);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_ca0,"CADNZD",&local_ca1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_ca0);
                                                    local_c79 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_c78,
                                                               &local_c79,(type *)0x0);
                                                    std::__cxx11::string::~string(local_ca0);
                                                    std::allocator<char>::~allocator(&local_ca1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c78)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_cb0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__29.message_,
                                                                 (internal *)local_c78,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"CADNZD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_cb8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xac,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_cb8,&local_cb0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_cb8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__29.message_);
                                                  testing::Message::~Message(&local_cb0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c78);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_d10,"CHFNZD",&local_d11);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_d10);
                                                    local_ce9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_ce8,
                                                               &local_ce9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_d10);
                                                    std::allocator<char>::~allocator(&local_d11);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ce8)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_d20);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__30.message_,
                                                                 (internal *)local_ce8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"CHFNZD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d28,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xad,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d28,&local_d20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d28);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__30.message_);
                                                  testing::Message::~Message(&local_d20);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ce8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_d80,"NOKNZD",&local_d81);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_d80);
                                                    local_d59 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_d58,
                                                               &local_d59,(type *)0x0);
                                                    std::__cxx11::string::~string(local_d80);
                                                    std::allocator<char>::~allocator(&local_d81);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_d58)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_d90);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__31.message_,
                                                                 (internal *)local_d58,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"NOKNZD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d98,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xae,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d98,&local_d90);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d98);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__31.message_);
                                                  testing::Message::~Message(&local_d90);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d58);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_df0,"DKKNZD",&local_df1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_df0);
                                                    local_dc9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_dc8,
                                                               &local_dc9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_df0);
                                                    std::allocator<char>::~allocator(&local_df1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_dc8)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_e00);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__32.message_,
                                                                 (internal *)local_dc8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"DKKNZD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_e08,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xaf,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e08,&local_e00);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e08);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__32.message_);
                                                  testing::Message::~Message(&local_e00);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_dc8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_e60,"SEKNZD",&local_e61);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_e60);
                                                    local_e39 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_e38,
                                                               &local_e39,(type *)0x0);
                                                    std::__cxx11::string::~string(local_e60);
                                                    std::allocator<char>::~allocator(&local_e61);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_e38)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_e70);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__33.message_,
                                                                 (internal *)local_e38,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"SEKNZD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_e78,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb0,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e78,&local_e70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e78);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__33.message_);
                                                  testing::Message::~Message(&local_e70);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e38);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_ed0,"JPYNZD",&local_ed1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_ed0);
                                                    local_ea9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_ea8,
                                                               &local_ea9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_ed0);
                                                    std::allocator<char>::~allocator(&local_ed1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ea8)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_ee0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__34.message_,
                                                                 (internal *)local_ea8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYNZD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_ee8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb1,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_ee8,&local_ee0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_ee8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__34.message_);
                                                  testing::Message::~Message(&local_ee0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ea8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_f40,"CADUSD",&local_f41);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_f40);
                                                    local_f19 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_f18,
                                                               &local_f19,(type *)0x0);
                                                    std::__cxx11::string::~string(local_f40);
                                                    std::allocator<char>::~allocator(&local_f41);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_f18)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_f50);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__35.message_,
                                                                 (internal *)local_f18,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"CADUSD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_f58,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb2,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_f58,&local_f50);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_f58);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__35.message_);
                                                  testing::Message::~Message(&local_f50);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f18);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_fb0,"CHFUSD",&local_fb1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_fb0);
                                                    local_f89 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_f88,
                                                               &local_f89,(type *)0x0);
                                                    std::__cxx11::string::~string(local_fb0);
                                                    std::allocator<char>::~allocator(&local_fb1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_f88)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_fc0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__36.message_,
                                                                 (internal *)local_f88,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"CHFUSD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_fc8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb3,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_fc8,&local_fc0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_fc8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__36.message_);
                                                  testing::Message::~Message(&local_fc0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f88);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1020,"NOKUSD",&local_1021);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1020);
                                                    local_ff9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_ff8,
                                                               &local_ff9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1020);
                                                    std::allocator<char>::~allocator(&local_1021);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ff8)
                                                    ;
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1030);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__37.message_,
                                                                 (internal *)local_ff8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"NOKUSD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1038,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb4,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1038,&local_1030);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1038);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__37.message_);
                                                  testing::Message::~Message(&local_1030);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ff8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1090,"DKKUSD",&local_1091);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1090);
                                                    local_1069 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1068,
                                                               &local_1069,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1090);
                                                    std::allocator<char>::~allocator(&local_1091);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1068
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_10a0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__38.message_,
                                                                 (internal *)local_1068,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"DKKUSD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_10a8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb5,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_10a8,&local_10a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_10a8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__38.message_);
                                                  testing::Message::~Message(&local_10a0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1068);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1100,"SEKUSD",&local_1101);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1100);
                                                    local_10d9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_10d8,
                                                               &local_10d9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1100);
                                                    std::allocator<char>::~allocator(&local_1101);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_10d8
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1110);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__39.message_,
                                                                 (internal *)local_10d8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"SEKUSD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1118,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb6,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1118,&local_1110);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1118);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__39.message_);
                                                  testing::Message::~Message(&local_1110);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_10d8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1170,"JPYUSD",&local_1171);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1170);
                                                    local_1149 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1148,
                                                               &local_1149,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1170);
                                                    std::allocator<char>::~allocator(&local_1171);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1148
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1180);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__40.message_,
                                                                 (internal *)local_1148,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYUSD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1188,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb7,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1188,&local_1180);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1188);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__40.message_);
                                                  testing::Message::~Message(&local_1180);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1148);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_11e0,"CHFCAD",&local_11e1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_11e0);
                                                    local_11b9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_11b8,
                                                               &local_11b9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_11e0);
                                                    std::allocator<char>::~allocator(&local_11e1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_11b8
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_11f0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__41.message_,
                                                                 (internal *)local_11b8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"CHFCAD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_11f8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb8,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_11f8,&local_11f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_11f8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__41.message_);
                                                  testing::Message::~Message(&local_11f0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_11b8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1250,"NOKCAD",&local_1251);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1250);
                                                    local_1229 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1228,
                                                               &local_1229,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1250);
                                                    std::allocator<char>::~allocator(&local_1251);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1228
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1260);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__42.message_,
                                                                 (internal *)local_1228,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"NOKCAD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1268,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xb9,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1268,&local_1260);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1268);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__42.message_);
                                                  testing::Message::~Message(&local_1260);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1228);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_12c0,"DKKCAD",&local_12c1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_12c0);
                                                    local_1299 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1298,
                                                               &local_1299,(type *)0x0);
                                                    std::__cxx11::string::~string(local_12c0);
                                                    std::allocator<char>::~allocator(&local_12c1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1298
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_12d0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__43.message_,
                                                                 (internal *)local_1298,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"DKKCAD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_12d8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xba,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_12d8,&local_12d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_12d8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__43.message_);
                                                  testing::Message::~Message(&local_12d0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1298);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1330,"SEKCAD",&local_1331);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1330);
                                                    local_1309 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1308,
                                                               &local_1309,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1330);
                                                    std::allocator<char>::~allocator(&local_1331);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1308
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1340);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__44.message_,
                                                                 (internal *)local_1308,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"SEKCAD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1348,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbb,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1348,&local_1340);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1348);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__44.message_);
                                                  testing::Message::~Message(&local_1340);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1308);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_13a0,"JPYCAD",&local_13a1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_13a0);
                                                    local_1379 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1378,
                                                               &local_1379,(type *)0x0);
                                                    std::__cxx11::string::~string(local_13a0);
                                                    std::allocator<char>::~allocator(&local_13a1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1378
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_13b0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__45.message_,
                                                                 (internal *)local_1378,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYCAD\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_13b8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbc,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_13b8,&local_13b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_13b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__45.message_);
                                                  testing::Message::~Message(&local_13b0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1378);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1410,"NOKCHF",&local_1411);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1410);
                                                    local_13e9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_13e8,
                                                               &local_13e9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1410);
                                                    std::allocator<char>::~allocator(&local_1411);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_13e8
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1420);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__46.message_,
                                                                 (internal *)local_13e8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"NOKCHF\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1428,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbd,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1428,&local_1420);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1428);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__46.message_);
                                                  testing::Message::~Message(&local_1420);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_13e8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1480,"DKKCHF",&local_1481);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1480);
                                                    local_1459 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1458,
                                                               &local_1459,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1480);
                                                    std::allocator<char>::~allocator(&local_1481);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1458
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1490);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__47.message_,
                                                                 (internal *)local_1458,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"DKKCHF\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1498,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbe,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1498,&local_1490);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1498);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__47.message_);
                                                  testing::Message::~Message(&local_1490);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1458);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_14f0,"SEKCHF",&local_14f1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_14f0);
                                                    local_14c9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_14c8,
                                                               &local_14c9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_14f0);
                                                    std::allocator<char>::~allocator(&local_14f1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_14c8
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1500);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__48.message_,
                                                                 (internal *)local_14c8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"SEKCHF\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1508,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xbf,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1508,&local_1500);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1508);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__48.message_);
                                                  testing::Message::~Message(&local_1500);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_14c8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1560,"JPYCHF",&local_1561);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1560);
                                                    local_1539 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1538,
                                                               &local_1539,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1560);
                                                    std::allocator<char>::~allocator(&local_1561);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1538
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1570);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__49.message_,
                                                                 (internal *)local_1538,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYCHF\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1578,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc0,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1578,&local_1570);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1578);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__49.message_);
                                                  testing::Message::~Message(&local_1570);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1538);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_15d0,"DKKNOK",&local_15d1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_15d0);
                                                    local_15a9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_15a8,
                                                               &local_15a9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_15d0);
                                                    std::allocator<char>::~allocator(&local_15d1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_15a8
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_15e0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__50.message_,
                                                                 (internal *)local_15a8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"DKKNOK\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_15e8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc1,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_15e8,&local_15e0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_15e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__50.message_);
                                                  testing::Message::~Message(&local_15e0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_15a8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1640,"SEKNOK",&local_1641);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1640);
                                                    local_1619 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1618,
                                                               &local_1619,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1640);
                                                    std::allocator<char>::~allocator(&local_1641);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1618
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1650);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__51.message_,
                                                                 (internal *)local_1618,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"SEKNOK\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1658,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc2,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1658,&local_1650);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1658);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__51.message_);
                                                  testing::Message::~Message(&local_1650);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1618);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_16b0,"JPYNOK",&local_16b1);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_16b0);
                                                    local_1689 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1688,
                                                               &local_1689,(type *)0x0);
                                                    std::__cxx11::string::~string(local_16b0);
                                                    std::allocator<char>::~allocator(&local_16b1);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1688
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_16c0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__52.message_,
                                                                 (internal *)local_1688,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYNOK\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_16c8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc3,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_16c8,&local_16c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_16c8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__52.message_);
                                                  testing::Message::~Message(&local_16c0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1688);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1720,"SEKDKK",&local_1721);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1720);
                                                    local_16f9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_16f8,
                                                               &local_16f9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1720);
                                                    std::allocator<char>::~allocator(&local_1721);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_16f8
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1730);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__53.message_,
                                                                 (internal *)local_16f8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"SEKDKK\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1738,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc4,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1738,&local_1730);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1738);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__53.message_);
                                                  testing::Message::~Message(&local_1730);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_16f8);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1790,"JPYDKK",&local_1791);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1790);
                                                    local_1769 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_1768,
                                                               &local_1769,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1790);
                                                    std::allocator<char>::~allocator(&local_1791);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_1768
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_17a0);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                ((string *)&gtest_ar__54.message_,
                                                                 (internal *)local_1768,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYDKK\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_17a8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc5,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_17a8,&local_17a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_17a8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar__54.message_);
                                                  testing::Message::~Message(&local_17a0);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1768);
                                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_1800,"JPYSEK",&local_1801);
                                                    bVar1 = bidfx_public_api::price::Currencies::
                                                            IsValidCurrencyPair(local_1800);
                                                    local_17d9 = (bool)(~bVar1 & 1);
                                                    testing::AssertionResult::AssertionResult<bool>
                                                              ((AssertionResult *)local_17d8,
                                                               &local_17d9,(type *)0x0);
                                                    std::__cxx11::string::~string(local_1800);
                                                    std::allocator<char>::~allocator(&local_1801);
                                                    bVar2 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_17d8
                                                                      );
                                                    if (!bVar2) {
                                                      testing::Message::Message(&local_1810);
                                                      testing::internal::
                                                      GetBoolAssertionFailureMessage_abi_cxx11_
                                                                (&local_1838,(internal *)local_17d8,
                                                                 (AssertionResult *)
                                                                                                                                  
                                                  "Currencies::IsValidCurrencyPair(\"JPYSEK\")",
                                                  "true","false",in_R9);
                                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1818,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                                                  ,0xc6,pcVar3);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1818,&local_1810);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1818);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1838);
                                                  testing::Message::~Message(&local_1810);
                                                  }
                                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_17d8);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(CurrenciesTest, test_inverse_pairs_are_not_valid)
{
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("GBPEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("AUDEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NZDEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYEUR"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("AUDGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NZDGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NZDAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYAUD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("USDNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CADUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYUSD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("CHFCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYCAD"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("NOKCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYCHF"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("DKKNOK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKNOK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYNOK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("SEKDKK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYDKK"));
    ASSERT_FALSE(Currencies::IsValidCurrencyPair("JPYSEK"));
}